

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

void __thiscall
QScrollerPrivate::createScrollingSegments
          (QScrollerPrivate *this,qreal v,qreal startPos,qreal deltaTime,qreal deltaPos,
          Orientation orientation)

{
  double dVar1;
  int iVar2;
  QScrollerPropertiesPrivate *pQVar3;
  QDebug QVar4;
  char cVar5;
  uint uVar6;
  Type TVar7;
  bool bVar8;
  ScrollType type;
  QQueue<QScrollerPrivate::ScrollSegment> *this_00;
  long in_FS_OFFSET;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  double p;
  qreal qVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  double local_128;
  qreal local_118;
  double local_f8;
  qreal local_c8;
  QDebug local_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  QDebug local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->properties).d.d;
  bVar9 = orientation != Horizontal;
  this_00 = &this->ySegments;
  if (!bVar9) {
    this_00 = &this->xSegments;
  }
  QList<QScrollerPrivate::ScrollSegment>::clear
            (&this_00->super_QList<QScrollerPrivate::ScrollSegment>);
  dVar15 = (&(this->contentPosRange).xp)[bVar9];
  dVar14 = (&(this->contentPosRange).w)[bVar9] + dVar15;
  if (((&pQVar3->hOvershootPolicy)[bVar9] == OvershootAlwaysOff) ||
     ((pQVar3->overshootScrollDistanceFactor == 0.0 && (!NAN(pQVar3->overshootScrollDistanceFactor))
      ))) {
    bVar8 = false;
  }
  else {
    bVar8 = dVar14 != 0.0 || (&pQVar3->hOvershootPolicy)[bVar9] == OvershootAlwaysOn;
  }
  dVar1 = (&(this->viewportSize).wd)[bVar9];
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78 = 2;
    local_74 = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar4.stream = local_58.stream;
    QVar16.m_data = (storage_type *)0x1f;
    QVar16.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,startPos);
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar4.stream = local_58.stream;
    QVar17.m_data = (storage_type *)0x7;
    QVar17.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,dVar14);
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar4.stream = local_58.stream;
    QVar18.m_data = (storage_type *)0x2;
    QVar18.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar18);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,orientation);
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
  }
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78 = 2;
    local_74 = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar4.stream = local_58.stream;
    QVar19.m_data = (storage_type *)0x4;
    QVar19.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar19);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,v);
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar4.stream = local_58.stream;
    QVar20.m_data = (storage_type *)0x17;
    QVar20.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar20);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,pQVar3->decelerationFactor);
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar4.stream = local_58.stream;
    QVar21.m_data = (storage_type *)0xe;
    QVar21.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar21);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    local_88.stream = local_58.stream;
    *(int *)(local_58.stream + 0x28) = *(int *)(local_58.stream + 0x28) + 1;
    uVar6 = QEasingCurve::type();
    qt_QMetaEnum_debugOperator
              (&local_80,(longlong)&local_88,(QMetaObject *)(ulong)uVar6,
               (char *)&QEasingCurve::staticMetaObject);
    QDebug::~QDebug(&local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug(&local_58);
  }
  lcScroller();
  if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78 = 2;
    local_74 = 0;
    uStack_6c = 0;
    local_64 = 0;
    local_60 = lcScroller::category.name;
    QMessageLogger::debug();
    QVar4.stream = local_58.stream;
    QVar22.m_data = (storage_type *)0xd;
    QVar22.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar22);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
    if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
      UNLOCK();
      if (*(int *)local_50[0].stream == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
      }
    }
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,deltaPos);
    if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
  }
  p = startPos + deltaPos;
  if (((startPos < dVar15) && (p < dVar15)) || ((dVar14 < startPos && (dVar14 < p)))) {
    local_f8 = pQVar3->overshootScrollTime * 0.7;
    local_128 = (double)(~-(ulong)(p < dVar15) & (ulong)dVar14 |
                        (ulong)dVar15 & -(ulong)(p < dVar15));
    local_118 = local_128 - startPos;
    TVar7 = QEasingCurve::type();
    type = ScrollTypeOvershoot;
  }
  else {
    local_128 = nextSnapPos(this,p,0,orientation);
    qVar12 = nextSnapPos(this,startPos,-1,orientation);
    dVar13 = nextSnapPos(this,startPos,1,orientation);
    lcScroller();
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_78 = 2;
      local_74 = 0;
      uStack_6c = 0;
      local_64 = 0;
      local_60 = lcScroller::category.name;
      QMessageLogger::debug();
      QVar4.stream = local_58.stream;
      QVar23.m_data = (storage_type *)0xd;
      QVar23.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar23);
      QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
      if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
        UNLOCK();
        if (*(int *)local_50[0].stream == 0) {
          QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,qVar12);
      if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,'-');
      if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,local_128);
      if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,'-');
      if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QTextStream::operator<<((QTextStream *)local_58.stream,dVar13);
      if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_58.stream,' ');
      }
      QDebug::~QDebug(&local_58);
    }
    if ((dVar13 < local_128) || (cVar5 = qIsNaN(dVar13), cVar5 != '\0')) {
      dVar13 = local_128;
    }
    if ((local_128 < qVar12) || (cVar5 = qIsNaN(qVar12), cVar5 != '\0')) {
      qVar12 = local_128;
    }
    uVar10 = -(ulong)(v < -v);
    if (pQVar3->minimumVelocity <= (double)(~uVar10 & (ulong)v | (ulong)-v & uVar10)) {
      if ((v <= 0.0) || (cVar5 = qIsNaN(dVar13), cVar5 != '\0')) {
        if ((v < 0.0) && (cVar5 = qIsNaN(qVar12), cVar5 == '\0')) {
          dVar13 = qVar12;
          if (p - startPos == 0.0) goto joined_r0x006674a8;
          goto LAB_006674aa;
        }
        local_128 = p;
        local_f8 = deltaTime;
        if (p < dVar15 || dVar14 < p) {
          local_128 = (double)(~-(ulong)(p < dVar15) & (ulong)dVar14 |
                              (ulong)dVar15 & -(ulong)(p < dVar15));
          lcScroller();
          if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
             ) {
            local_78 = 2;
            local_74 = 0;
            uStack_6c = 0;
            local_64 = 0;
            local_60 = lcScroller::category.name;
            QMessageLogger::debug();
            QVar4.stream = local_58.stream;
            QVar25.m_data = (storage_type *)0x11;
            QVar25.m_size = (qsizetype)local_50;
            QString::fromUtf8(QVar25);
            QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
            if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
              UNLOCK();
              if (*(int *)local_50[0].stream == 0) {
                QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
              }
            }
            if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_58.stream,' ');
            }
            QTextStream::operator<<((QTextStream *)local_58.stream,local_128 - startPos);
            if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                      super___atomic_base<int>._M_i == '\x01') {
              QTextStream::operator<<((QTextStream *)local_58.stream,' ');
            }
            QDebug::~QDebug(&local_58);
          }
          if (bVar8) {
            dVar15 = (local_128 - startPos) / deltaPos;
            uVar10 = -(ulong)(dVar15 < -dVar15);
            qVar12 = progressForValue(&pQVar3->scrollingCurve,
                                      (qreal)(~uVar10 & (ulong)dVar15 | (ulong)-dVar15 & uVar10));
            local_f8 = pQVar3->overshootScrollTime;
            local_c8 = (local_f8 * 0.3) / deltaTime + qVar12;
            if (1.0 <= local_c8) {
              local_c8 = 1.0;
            }
            dVar15 = (double)QEasingCurve::valueForProgress(local_c8);
            dVar15 = (dVar15 * deltaPos + startPos) - local_128;
            dVar14 = dVar1 * pQVar3->overshootScrollDistanceFactor *
                     (double)(-(ulong)(dVar15 < 0.0) & 0xbff0000000000000 |
                             ~-(ulong)(dVar15 < 0.0) & -(ulong)(0.0 < dVar15) & 0x3ff0000000000000);
            lcScroller();
            if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
                0) {
              local_78 = 2;
              local_74 = 0;
              uStack_6c = 0;
              local_64 = 0;
              local_60 = lcScroller::category.name;
              QMessageLogger::debug();
              QVar4.stream = local_58.stream;
              QVar26.m_data = (storage_type *)0xc;
              QVar26.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar26);
              QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
              if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                LOCK();
                *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                UNLOCK();
                if (*(int *)local_50[0].stream == 0) {
                  QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_58.stream,dVar15);
              if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QVar4.stream = local_58.stream;
              QVar27.m_data = (storage_type *)0x4;
              QVar27.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar27);
              QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
              if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                LOCK();
                *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                UNLOCK();
                if (*(int *)local_50[0].stream == 0) {
                  QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_58.stream,dVar14);
              if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QVar4.stream = local_58.stream;
              QVar28.m_data = (storage_type *)0xc;
              QVar28.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar28);
              QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
              if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                LOCK();
                *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                UNLOCK();
                if (*(int *)local_50[0].stream == 0) {
                  QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                }
              }
              if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_58.stream,qVar12);
              if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_58.stream,local_c8);
              if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                        super___atomic_base<int>._M_i == '\x01') {
                QTextStream::operator<<((QTextStream *)local_58.stream,' ');
              }
              QDebug::~QDebug(&local_58);
            }
            uVar10 = -(ulong)(dVar15 < -dVar15);
            uVar11 = -(ulong)(dVar14 < -dVar14);
            if ((double)(~uVar11 & (ulong)dVar14 | (ulong)-dVar14 & uVar11) <
                (double)(~uVar10 & (ulong)dVar15 | (ulong)-dVar15 & uVar10)) {
              dVar15 = ((local_128 + dVar14) - startPos) / deltaPos;
              uVar10 = -(ulong)(dVar15 < -dVar15);
              local_c8 = progressForValue(&pQVar3->scrollingCurve,
                                          (qreal)(~uVar10 & (ulong)dVar15 | (ulong)-dVar15 & uVar10)
                                         );
              lcScroller();
              dVar15 = dVar14;
              if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
                  != 0) {
                local_78 = 2;
                local_74 = 0;
                uStack_6c = 0;
                local_64 = 0;
                local_60 = lcScroller::category.name;
                QMessageLogger::debug();
                QVar4.stream = local_58.stream;
                QVar29.m_data = (storage_type *)0xc;
                QVar29.m_size = (qsizetype)local_50;
                QString::fromUtf8(QVar29);
                QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
                if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                  UNLOCK();
                  if (*(int *)local_50[0].stream == 0) {
                    QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                  }
                }
                if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                          super___atomic_base<int>._M_i == '\x01') {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QTextStream::operator<<((QTextStream *)local_58.stream,dVar14);
                if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                          super___atomic_base<int>._M_i == '\x01') {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QVar4.stream = local_58.stream;
                QVar30.m_data = (storage_type *)0x4;
                QVar30.m_size = (qsizetype)local_50;
                QString::fromUtf8(QVar30);
                QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
                if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                  UNLOCK();
                  if (*(int *)local_50[0].stream == 0) {
                    QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                  }
                }
                if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                          super___atomic_base<int>._M_i == '\x01') {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QTextStream::operator<<((QTextStream *)local_58.stream,dVar14);
                if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                          super___atomic_base<int>._M_i == '\x01') {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QVar4.stream = local_58.stream;
                QVar31.m_data = (storage_type *)0xc;
                QVar31.m_size = (qsizetype)local_50;
                QString::fromUtf8(QVar31);
                QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
                if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
                  LOCK();
                  *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
                  UNLOCK();
                  if (*(int *)local_50[0].stream == 0) {
                    QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
                  }
                }
                if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                          super___atomic_base<int>._M_i == '\x01') {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QTextStream::operator<<((QTextStream *)local_58.stream,qVar12);
                if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                          super___atomic_base<int>._M_i == '\x01') {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QTextStream::operator<<((QTextStream *)local_58.stream,local_c8);
                if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.
                          super___atomic_base<int>._M_i == '\x01') {
                  QTextStream::operator<<((QTextStream *)local_58.stream,' ');
                }
                QDebug::~QDebug(&local_58);
              }
            }
            TVar7 = QEasingCurve::type();
            pushSegment(this,ScrollTypeFlick,deltaTime,local_c8,startPos,deltaPos,local_128 + dVar15
                        ,TVar7,orientation);
            local_f8 = local_f8 * 0.7;
            local_118 = -dVar15;
            TVar7 = QEasingCurve::type();
            type = ScrollTypeOvershoot;
            startPos = local_128 + dVar15;
            goto LAB_006666bb;
          }
        }
      }
      else {
        if (p - startPos == 0.0) {
joined_r0x006674a8:
          if (NAN(p - startPos)) goto LAB_006674aa;
        }
        else {
LAB_006674aa:
          dVar15 = (dVar13 - startPos) / (p - startPos);
          uVar10 = -(ulong)(dVar15 < -dVar15);
          deltaTime = deltaTime * (double)(~uVar10 & (ulong)dVar15 | (ulong)-dVar15 & uVar10);
        }
        local_f8 = pQVar3->snapTime;
        local_128 = dVar13;
        if (deltaTime <= local_f8) {
          local_f8 = deltaTime;
        }
      }
      TVar7 = QEasingCurve::type();
      type = ScrollTypeFlick;
      local_118 = deltaPos;
    }
    else {
      lcScroller();
      if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        local_78 = 2;
        local_74 = 0;
        uStack_6c = 0;
        local_64 = 0;
        local_60 = lcScroller::category.name;
        QMessageLogger::debug();
        QVar4.stream = local_58.stream;
        QVar24.m_data = (storage_type *)0x15;
        QVar24.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar24);
        QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_50);
        if ((QArrayData *)local_50[0].stream != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_50[0].stream = *(int *)local_50[0].stream + -1;
          UNLOCK();
          if (*(int *)local_50[0].stream == 0) {
            QArrayData::deallocate((QArrayData *)local_50[0].stream,2,0x10);
          }
        }
        if ((char)(((QArrayData *)(local_58.stream + 0x30))->ref_)._q_value.super___atomic_base<int>
                  ._M_i == '\x01') {
          QTextStream::operator<<((QTextStream *)local_58.stream,' ');
        }
        local_98.stream = local_58.stream;
        iVar2 = *(int *)(local_58.stream + 0x28);
        *(int *)(local_58.stream + 0x28) = iVar2 + 1;
        local_50[0].stream = local_58.stream;
        *(int *)(local_58.stream + 0x28) = iVar2 + 2;
        qt_QMetaEnum_flagDebugOperator
                  (&local_90,(ulonglong)local_50,(QMetaObject *)(ulong)orientation,
                   (char *)&Qt::staticMetaObject);
        QDebug::~QDebug(local_50);
        QDebug::~QDebug(&local_90);
        QDebug::~QDebug(&local_98);
        QDebug::~QDebug(&local_58);
      }
      cVar5 = qIsNaN(local_128);
      if (local_128 == startPos || cVar5 != '\0') goto LAB_006666c4;
      dVar15 = pQVar3->snapPositionRatio;
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        dVar14 = (&(this->lastPosition).xp)[orientation != Horizontal] -
                 (&(this->pressPosition).xp)[orientation != Horizontal];
        dVar15 = dVar14 / dVar15;
        uVar10 = -(ulong)(dVar15 < -dVar15);
        if ((double)(~uVar10 & (ulong)dVar15 | (ulong)-dVar15 & uVar10) <= dVar13 - qVar12) {
          uVar10 = -(ulong)(dVar14 < 0.0);
          local_128 = (double)(~uVar10 & (ulong)dVar13 | (ulong)qVar12 & uVar10);
        }
      }
      dVar15 = (local_128 - startPos) * 0.3 + startPos;
      pushSegment(this,ScrollTypeFlick,pQVar3->snapTime * 0.3,1.0,startPos,dVar15 - startPos,dVar15,
                  InQuad,orientation);
      local_f8 = pQVar3->snapTime * 0.7;
      local_118 = local_128 - dVar15;
      TVar7 = QEasingCurve::type();
      type = ScrollTypeFlick;
      startPos = dVar15;
    }
  }
LAB_006666bb:
  pushSegment(this,type,local_f8,1.0,startPos,local_118,local_128,TVar7,orientation);
LAB_006666c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::createScrollingSegments(qreal v, qreal startPos,
                                               qreal deltaTime, qreal deltaPos,
                                               Qt::Orientation orientation)
{
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    QScrollerProperties::OvershootPolicy policy;
    qreal minPos;
    qreal maxPos;
    qreal viewSize;

    if (orientation == Qt::Horizontal) {
        xSegments.clear();
        policy = sp->hOvershootPolicy;
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
        viewSize = viewportSize.width();
    } else {
        ySegments.clear();
        policy = sp->vOvershootPolicy;
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
        viewSize = viewportSize.height();
    }

    bool alwaysOvershoot = (policy == QScrollerProperties::OvershootAlwaysOn);
    bool noOvershoot = (policy == QScrollerProperties::OvershootAlwaysOff) || !sp->overshootScrollDistanceFactor;
    bool canOvershoot = !noOvershoot && (alwaysOvershoot || maxPos);

    qCDebug(lcScroller) << "+++ createScrollingSegments: s:" << startPos << "maxPos:" << maxPos
                        << "o:" << int(orientation);

    qCDebug(lcScroller) << "v = " << v << ", decelerationFactor = " << sp->decelerationFactor
                        << ", curveType = " << sp->scrollingCurve.type();

    qreal endPos = startPos + deltaPos;

    qCDebug(lcScroller) << "  Real Delta:" << deltaPos;

    // -- check if are in overshoot and end in overshoot
    if ((startPos < minPos && endPos < minPos) ||
        (startPos > maxPos && endPos > maxPos)) {
        qreal stopPos = endPos < minPos ? minPos : maxPos;
        qreal oDeltaTime = sp->overshootScrollTime;

        pushSegment(ScrollTypeOvershoot, oDeltaTime * qreal(0.7), qreal(1.0), startPos,
                    stopPos - startPos, stopPos, sp->scrollingCurve.type(), orientation);
        return;
    }

    // -- determine snap points
    qreal nextSnap = nextSnapPos(endPos, 0, orientation);
    qreal lowerSnapPos = nextSnapPos(startPos, -1, orientation);
    qreal higherSnapPos = nextSnapPos(startPos, 1, orientation);

    qCDebug(lcScroller) << "  Real Delta:" << lowerSnapPos << '-' << nextSnap << '-' <<higherSnapPos;

    // - check if we can reach another snap point
    if (nextSnap > higherSnapPos || qIsNaN(higherSnapPos))
        higherSnapPos = nextSnap;
    if (nextSnap < lowerSnapPos || qIsNaN(lowerSnapPos))
        lowerSnapPos = nextSnap;

    if (qAbs(v) < sp->minimumVelocity) {

        qCDebug(lcScroller) << "### below minimum Vel" << orientation;

        // - no snap points or already at one
        if (qIsNaN(nextSnap) || nextSnap == startPos)
            return; // nothing to do, no scrolling needed.

        // - decide which point to use

        qreal snapDistance = higherSnapPos - lowerSnapPos;

        qreal pressDistance = (orientation == Qt::Horizontal) ?
            lastPosition.x() - pressPosition.x() :
            lastPosition.y() - pressPosition.y();

        // if not dragged far enough, pick the next snap point.
        if (sp->snapPositionRatio == 0.0 || qAbs(pressDistance / sp->snapPositionRatio) > snapDistance)
            endPos = nextSnap;
        else if (pressDistance < 0.0)
            endPos = lowerSnapPos;
        else
            endPos = higherSnapPos;

        deltaPos = endPos - startPos;
        qreal midPos = startPos + deltaPos * qreal(0.3);
        pushSegment(ScrollTypeFlick, sp->snapTime * qreal(0.3), qreal(1.0), startPos,
                    midPos - startPos, midPos, QEasingCurve::InQuad, orientation);
        pushSegment(ScrollTypeFlick, sp->snapTime * qreal(0.7), qreal(1.0), midPos,
                    endPos - midPos, endPos, sp->scrollingCurve.type(), orientation);
        return;
    }

    // - go to the next snappoint if there is one
    if (v > 0 && !qIsNaN(higherSnapPos)) {
        // change the time in relation to the changed end position
        if (endPos - startPos)
            deltaTime *= qAbs((higherSnapPos - startPos) / (endPos - startPos));
        if (deltaTime > sp->snapTime)
            deltaTime = sp->snapTime;
        endPos = higherSnapPos;

    } else if (v < 0 && !qIsNaN(lowerSnapPos)) {
        // change the time in relation to the changed end position
        if (endPos - startPos)
            deltaTime *= qAbs((lowerSnapPos - startPos) / (endPos - startPos));
        if (deltaTime > sp->snapTime)
            deltaTime = sp->snapTime;
        endPos = lowerSnapPos;

    // -- check if we are overshooting
    } else if (endPos < minPos || endPos > maxPos) {
        qreal stopPos = endPos < minPos ? minPos : maxPos;

        qCDebug(lcScroller) << "Overshoot: delta:" << (stopPos - startPos);

        if (!canOvershoot) {
            pushSegment(ScrollTypeFlick, deltaTime, qreal(1), startPos, deltaPos, stopPos,
                        sp->scrollingCurve.type(), orientation);
        } else {
            qreal stopProgress = progressForValue(sp->scrollingCurve, qAbs((stopPos - startPos) / deltaPos));
            qreal oDeltaTime = sp->overshootScrollTime;
            qreal oStopProgress = qMin(stopProgress + oDeltaTime * qreal(0.3) / deltaTime, qreal(1));
            qreal oDistance = startPos + deltaPos * sp->scrollingCurve.valueForProgress(oStopProgress) - stopPos;
            qreal oMaxDistance = qSign(oDistance) * (viewSize * sp->overshootScrollDistanceFactor);

            qCDebug(lcScroller) << "1 oDistance:" << oDistance << "Max:" << oMaxDistance
                                << "stopP/oStopP" << stopProgress << oStopProgress;

            if (qAbs(oDistance) > qAbs(oMaxDistance)) {
                oStopProgress = progressForValue(sp->scrollingCurve,
                                                 qAbs((stopPos + oMaxDistance - startPos) / deltaPos));
                oDistance = oMaxDistance;
                qCDebug(lcScroller) << "2 oDistance:" << oDistance << "Max:" << oMaxDistance
                                    << "stopP/oStopP" << stopProgress << oStopProgress;
            }

            pushSegment(ScrollTypeFlick, deltaTime, oStopProgress, startPos, deltaPos,
                        stopPos + oDistance, sp->scrollingCurve.type(), orientation);
            pushSegment(ScrollTypeOvershoot, oDeltaTime * qreal(0.7), qreal(1.0),
                        stopPos + oDistance, -oDistance, stopPos, sp->scrollingCurve.type(),
                        orientation);
        }
        return;
    }

    pushSegment(ScrollTypeFlick, deltaTime, qreal(1.0), startPos, deltaPos, endPos,
                sp->scrollingCurve.type(), orientation);
}